

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::RequestsCache
          (RequestsCache *this,event_base *aEventBase,Action *aRetransmitter)

{
  function<void_(ot::commissioner::Timer_&)> local_40;
  Action *local_20;
  Action *aRetransmitter_local;
  event_base *aEventBase_local;
  RequestsCache *this_local;
  
  local_20 = aRetransmitter;
  aRetransmitter_local = (Action *)aEventBase;
  aEventBase_local = (event_base *)this;
  std::function<void_(ot::commissioner::Timer_&)>::function(&local_40,aRetransmitter);
  Timer::Timer(&this->mRetransmissionTimer,aEventBase,&local_40,true);
  std::function<void_(ot::commissioner::Timer_&)>::~function(&local_40);
  std::
  multiset<ot::commissioner::coap::Coap::RequestHolder,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
  ::multiset(&this->mContainer);
  return;
}

Assistant:

RequestsCache(struct event_base *aEventBase, Timer::Action aRetransmitter)
            : mRetransmissionTimer(aEventBase, aRetransmitter)
        {
        }